

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * google::protobuf::compiler::python::anon_unknown_0::
         NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *separator)

{
  bool bVar1;
  string *psVar2;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined4 local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_68 [8];
  string prefix;
  Descriptor *parent;
  string name;
  string *separator_local;
  Descriptor *descriptor_local;
  
  name.field_2._8_8_ = separator;
  psVar2 = Descriptor::name_abi_cxx11_(descriptor);
  std::__cxx11::string::string((string *)&parent,(string *)psVar2);
  prefix.field_2._8_8_ = Descriptor::containing_type(descriptor);
  if ((Descriptor *)prefix.field_2._8_8_ == (Descriptor *)0x0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            name.field_2._8_8_,".");
    if (bVar1) {
      ResolveKeyword(&local_120,(string *)&parent);
      std::__cxx11::string::operator=((string *)&parent,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&parent);
    local_dc = 1;
  }
  else {
    NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
              ((string *)local_68,(Descriptor *)prefix.field_2._8_8_,(string *)name.field_2._8_8_);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            name.field_2._8_8_,".");
    if ((bVar1) && (bVar1 = IsPythonKeyword((string *)&parent), bVar1)) {
      std::operator+(&local_d8,"getattr(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      std::operator+(&local_b8,&local_d8,", \'");
      std::operator+(&local_98,&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent);
      std::operator+(__return_storage_ptr__,&local_98,"\')");
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     name.field_2._8_8_);
      std::operator+(__return_storage_ptr__,&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent);
      std::__cxx11::string::~string((string *)&local_100);
    }
    local_dc = 1;
    std::__cxx11::string::~string((string *)local_68);
  }
  std::__cxx11::string::~string((string *)&parent);
  return __return_storage_ptr__;
}

Assistant:

std::string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                        const std::string& separator) {
  std::string name = descriptor.name();
  const Descriptor* parent = descriptor.containing_type();
  if (parent != nullptr) {
    std::string prefix = NamePrefixedWithNestedTypes(*parent, separator);
    if (separator == "." && IsPythonKeyword(name)) {
      return "getattr(" + prefix + ", '" + name + "')";
    } else {
      return prefix + separator + name;
    }
  }
  if (separator == ".") {
    name = ResolveKeyword(name);
  }
  return name;
}